

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O2

void __thiscall Assimp::glTFImporter::ImportCommonMetadata(glTFImporter *this,Asset *a)

{
  aiScene *paVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  aiMetadata *paVar6;
  size_t sVar7;
  allocator<char> local_459;
  string local_458;
  aiString local_434;
  
  paVar1 = this->mScene;
  if (paVar1->mMetaData == (aiMetadata *)0x0) {
    sVar2 = (a->asset).version._M_string_length;
    sVar3 = (a->asset).copyright._M_string_length;
    sVar4 = (a->asset).generator._M_string_length;
    if ((sVar4 != 0 || sVar2 != 0) || sVar3 != 0) {
      paVar6 = (aiMetadata *)operator_new(0x18);
      paVar6->mNumProperties = 0;
      paVar6->mKeys = (aiString *)0x0;
      paVar6->mValues = (aiMetadataEntry *)0x0;
      paVar1->mMetaData = paVar6;
      if (sVar2 != 0) {
        paVar6 = this->mScene->mMetaData;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"SourceAsset_FormatVersion",&local_459);
        uVar5 = (a->asset).version._M_string_length;
        sVar7 = 0x3ff;
        if ((uVar5 & 0xfffffc00) == 0) {
          sVar7 = uVar5 & 0xffffffff;
        }
        local_434.length = (ai_uint32)sVar7;
        memcpy(local_434.data,(a->asset).version._M_dataplus._M_p,sVar7);
        local_434.data[sVar7] = '\0';
        aiMetadata::Add<aiString>(paVar6,&local_458,&local_434);
        std::__cxx11::string::~string((string *)&local_458);
      }
      if (sVar4 != 0) {
        paVar6 = this->mScene->mMetaData;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"SourceAsset_Generator",&local_459);
        uVar5 = (a->asset).generator._M_string_length;
        sVar7 = 0x3ff;
        if ((uVar5 & 0xfffffc00) == 0) {
          sVar7 = uVar5 & 0xffffffff;
        }
        local_434.length = (ai_uint32)sVar7;
        memcpy(local_434.data,(a->asset).generator._M_dataplus._M_p,sVar7);
        local_434.data[sVar7] = '\0';
        aiMetadata::Add<aiString>(paVar6,&local_458,&local_434);
        std::__cxx11::string::~string((string *)&local_458);
      }
      if (sVar3 != 0) {
        paVar6 = this->mScene->mMetaData;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"SourceAsset_Copyright",&local_459);
        uVar5 = (a->asset).copyright._M_string_length;
        sVar7 = 0x3ff;
        if ((uVar5 & 0xfffffc00) == 0) {
          sVar7 = uVar5 & 0xffffffff;
        }
        local_434.length = (ai_uint32)sVar7;
        memcpy(local_434.data,(a->asset).copyright._M_dataplus._M_p,sVar7);
        local_434.data[sVar7] = '\0';
        aiMetadata::Add<aiString>(paVar6,&local_458,&local_434);
        std::__cxx11::string::~string((string *)&local_458);
      }
    }
    return;
  }
  __assert_fail("mScene->mMetaData == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFImporter.cpp"
                ,0x2bf,"void Assimp::glTFImporter::ImportCommonMetadata(glTF::Asset &)");
}

Assistant:

void glTFImporter::ImportCommonMetadata(glTF::Asset& a)
{
    ai_assert(mScene->mMetaData == nullptr);
    const bool hasVersion = !a.asset.version.empty();
    const bool hasGenerator = !a.asset.generator.empty();
    const bool hasCopyright = !a.asset.copyright.empty();
    if (hasVersion || hasGenerator || hasCopyright)
    {
        mScene->mMetaData = new aiMetadata;
        if (hasVersion)
        {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_FORMAT_VERSION, aiString(a.asset.version));
        }
        if (hasGenerator)
        {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_GENERATOR, aiString(a.asset.generator));
        }
        if (hasCopyright)
        {
            mScene->mMetaData->Add(AI_METADATA_SOURCE_COPYRIGHT, aiString(a.asset.copyright));
        }
    }
}